

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = (uint)potential_above->Flags >> 0x19 & 1;
  uVar3 = (uint)potential_below->Flags >> 0x19 & 1;
  if (uVar2 != uVar3) {
    return uVar3 < uVar2;
  }
  uVar4 = (ulong)(uint)(GImGui->Windows).Size;
  while( true ) {
    if ((int)uVar4 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[uVar4 - 1];
    if (pIVar1 == potential_above) break;
    uVar4 = uVar4 - 1;
    if (pIVar1 == potential_below) {
      return false;
    }
  }
  return true;
}

Assistant:

static inline int GetWindowDisplayLayer(ImGuiWindow* window)
{
    return (window->Flags & ImGuiWindowFlags_Tooltip) ? 1 : 0;
}